

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,QMimeTypeXMLData>::emplace<QMimeTypeXMLData_const&>
          (QHash<QString,_QMimeTypeXMLData> *this,QString *key,QMimeTypeXMLData *args)

{
  long lVar1;
  bool bVar2;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  QHash<QString,_QMimeTypeXMLData> copy;
  QMimeTypeXMLData *in_stack_fffffffffffffef8;
  QMimeTypeXMLData *in_stack_ffffffffffffff00;
  QMimeTypeXMLData *in_stack_ffffffffffffff08;
  QString *in_stack_ffffffffffffff10;
  QHash<QString,_QMimeTypeXMLData> *in_stack_ffffffffffffff18;
  undefined1 local_90 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<QString,_QMimeTypeXMLData>::isDetached
                    ((QHash<QString,_QMimeTypeXMLData> *)in_stack_ffffffffffffff00);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::shouldGrow
                      ((Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)*in_RDI);
    if (bVar2) {
      QMimeTypeXMLData::QMimeTypeXMLData(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_90 = (undefined1  [16])
                 QHash<QString,_QMimeTypeXMLData>::emplace_helper<QMimeTypeXMLData>
                           (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                            in_stack_ffffffffffffff08);
      QMimeTypeXMLData::~QMimeTypeXMLData(in_stack_ffffffffffffff00);
    }
    else {
      local_90 = (undefined1  [16])
                 emplace_helper<QMimeTypeXMLData_const&>
                           (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                            in_stack_ffffffffffffff08);
    }
  }
  else {
    QHash<QString,_QMimeTypeXMLData>::QHash
              ((QHash<QString,_QMimeTypeXMLData> *)in_stack_ffffffffffffff00,
               (QHash<QString,_QMimeTypeXMLData> *)in_stack_fffffffffffffef8);
    QHash<QString,_QMimeTypeXMLData>::detach
              ((QHash<QString,_QMimeTypeXMLData> *)in_stack_ffffffffffffff00);
    local_90 = (undefined1  [16])
               emplace_helper<QMimeTypeXMLData_const&>
                         (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff08);
    QHash<QString,_QMimeTypeXMLData>::~QHash
              ((QHash<QString,_QMimeTypeXMLData> *)in_stack_ffffffffffffff00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar3.i.d = (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)local_90._0_8_;
    iVar3.i.bucket = local_90._8_8_;
    return (iterator)iVar3.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }